

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O1

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  pointer pcVar5;
  cmCPackLog *pcVar6;
  cmCPackInstallationType *pcVar7;
  byte bVar8;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt_00;
  cmCPackGenerator *pcVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  string *psVar13;
  ulong uVar14;
  ostream *poVar15;
  size_t sVar16;
  long lVar17;
  mapped_type *pmVar18;
  string *psVar19;
  const_iterator cVar20;
  cmValue cVar21;
  _Rb_tree_node_base *p_Var22;
  long *plVar23;
  undefined8 *puVar24;
  _Base_ptr p_Var25;
  ulong *puVar26;
  size_type *psVar27;
  ulong uVar28;
  size_type sVar29;
  char *extraout_RDX;
  pointer pbVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _Alloc_hider _Var32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [8];
  pointer ppcVar36;
  byte bVar37;
  cmCPackNSISGenerator *pcVar38;
  pointer pbVar39;
  string_view name;
  string_view name_00;
  string_view componentName;
  string_view componentName_00;
  string_view componentName_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_15;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string output;
  string nsisFileName;
  string nsisInstallOptions;
  string nsisPreArguments;
  string nsisPostArguments;
  string nsisCmd;
  ostringstream cmCPackLog_msg;
  string componentDescriptions;
  string installerHeaderImage;
  string fileN_1;
  int retVal;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  string defines;
  string installTypesCode;
  string tmpFile;
  string nsisInFileName;
  string nsisInInstallOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  ostringstream dstr;
  ostringstream str;
  string local_a48;
  cmCPackNSISGenerator *local_a28;
  string local_a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8;
  long local_9b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  string local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_968;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_958;
  string local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_928;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_918;
  undefined1 local_908 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_900;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8e8;
  undefined8 local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  undefined8 local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined1 *local_870;
  undefined8 local_868;
  string local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660;
  _Rb_tree_node_base *local_640;
  undefined1 local_638 [16];
  undefined1 local_628 [96];
  ios_base local_5c8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490;
  undefined7 uStack_48f;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> local_480;
  undefined1 *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  string local_448;
  string local_428;
  undefined1 *local_408;
  undefined8 local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 local_340;
  uint7 uStack_33f;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328;
  uint7 uStack_327;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_328 = 0;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_330;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_338;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_327 << 8;
  name._M_str = "NSIS.template.in";
  name._M_len = 0x10;
  cmCPackGenerator::FindTemplate_abi_cxx11_(&local_3c8,&this->super_cmCPackGenerator,name,alt);
  if (local_3c8._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_908,"CPack error: Could not find NSIS installer template file.",0x39
              );
    std::ios::widen((char)(ostream *)local_908 + (char)*(long *)((long)local_908 + -0x18));
    std::ostream::put((char)local_908);
    std::ostream::flush();
    pcVar6 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar34 = local_1a8._0_8_;
    sVar16 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar6,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x31,(char *)uVar34,sVar16);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
    std::ios_base::~ios_base((ios_base *)&local_898);
    iVar12 = 0;
    goto LAB_001be9d2;
  }
  local_340 = 0;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_348;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_350;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_33f << 8;
  name_00._M_str = "NSIS.InstallOptions.ini.in";
  name_00._M_len = 0x1a;
  cmCPackGenerator::FindTemplate_abi_cxx11_(&local_388,&this->super_cmCPackGenerator,name_00,alt_00)
  ;
  if (local_388._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_908,"CPack error: Could not find NSIS installer options file.",0x38)
    ;
    std::ios::widen((char)(ostream *)local_908 + (char)*(long *)((long)local_908 + -0x18));
    std::ostream::put((char)local_908);
    std::ostream::flush();
    pcVar6 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar34 = local_1a8._0_8_;
    sVar16 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar6,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x39,(char *)uVar34,sVar16);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
    std::ios_base::~ios_base((ios_base *)&local_898);
    iVar12 = 0;
  }
  else {
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_TOPLEVEL_DIRECTORY","");
    psVar13 = (string *)
              cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_908);
    if (psVar13 == (string *)0x0) {
      psVar13 = &cmValue::Empty_abi_cxx11_;
    }
    local_9e8 = &local_9d8;
    pcVar5 = (psVar13->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9e8,pcVar5,pcVar5 + psVar13->_M_string_length);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    local_908 = (undefined1  [8])local_9e0;
    local_900 = local_9e8;
    local_8f8._M_allocated_capacity = 0;
    local_8f8._8_8_ = 0xf;
    local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x81f975;
    local_8e0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_908;
    cmCatViews(&local_3e8,views);
    local_9c8._M_allocated_capacity = (size_type)local_9b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9c8,local_9e8,local_9e0->_M_local_buf + (long)local_9e8);
    std::__cxx11::string::append(local_9c8._M_local_buf);
    std::__cxx11::string::append((char *)&local_9e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar39 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar30 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_a28 = this;
    if (pbVar39 != pbVar30) {
      local_640 = (_Rb_tree_node_base *)&(this->super_cmCPackGenerator).toplevel;
      do {
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"$INSTDIR","");
        cmSystemTools::RelativePath((string *)local_320,(string *)local_640,pbVar39);
        if ((local_a28->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
            _M_node_count != 0) {
          uVar14 = std::__cxx11::string::find((char)(string *)local_320,0x2f);
          if (uVar14 == 0xffffffffffffffff) {
            componentName_00._M_str = (char *)local_320._0_8_;
            componentName_00._M_len = local_320._8_8_;
            CustomComponentInstallDirectory_abi_cxx11_
                      ((string *)local_638,local_a28,componentName_00);
          }
          else {
            uVar28 = local_320._8_8_;
            if (uVar14 <= (ulong)local_320._8_8_) {
              uVar28 = uVar14;
            }
            componentName._M_str = (char *)local_320._0_8_;
            componentName._M_len = uVar28;
            CustomComponentInstallDirectory_abi_cxx11_((string *)local_638,local_a28,componentName);
          }
          std::__cxx11::string::operator=((string *)local_908,(string *)local_638);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628) {
            operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
          }
          std::__cxx11::string::substr((ulong)local_638,(ulong)local_320);
          std::__cxx11::string::operator=((string *)local_320,(string *)local_638);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628) {
            operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
          }
        }
        if (local_320._8_8_ != 0) {
          uVar14 = 0;
          do {
            if (*(char *)(local_320._0_8_ + uVar14) == '/') {
              *(char *)(local_320._0_8_ + uVar14) = '\\';
            }
            uVar14 = uVar14 + 1;
          } while (local_320._8_8_ != uVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Delete \"",10);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_908,(long)local_900);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\\",1);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,(char *)local_320._0_8_,local_320._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        pbVar39 = pbVar39 + 1;
      } while (pbVar39 != pbVar30);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_908,"Uninstall Files: ",0x11);
    pcVar38 = local_a28;
    std::__cxx11::stringbuf::str();
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_908,(char *)local_320._0_8_,local_320._8_8_);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pcVar4 = local_320 + 0x10;
    if ((char *)local_320._0_8_ != pcVar4) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    pcVar6 = (pcVar38->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar34 = local_320._0_8_;
    sVar16 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar6,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x58,(char *)uVar34,sVar16);
    if ((char *)local_320._0_8_ != pcVar4) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
    std::ios_base::~ios_base((ios_base *)&local_898);
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_DELETE_FILES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_320);
    if ((char *)local_320._0_8_ != pcVar4) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetListOfSubdirectories
              (pcVar38,(pcVar38->super_cmCPackGenerator).toplevel._M_dataplus._M_p,&local_368);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    pbVar39 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar9 = &local_a28->super_cmCPackGenerator;
      local_640 = (_Rb_tree_node_base *)&(local_a28->super_cmCPackGenerator).Components;
      pbVar30 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_908 = (undefined1  [8])&local_8f8;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_8f8._M_allocated_capacity = local_8f8._M_allocated_capacity & 0xffffffffffffff00;
        cmSystemTools::RelativePath((string *)local_638,&pcVar9->toplevel,pbVar30);
        if (local_638._8_8_ != 0) {
          if (((local_a28->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
               _M_node_count != 0) &&
             (lVar17 = std::__cxx11::string::find((char)(string *)local_638,0x2f), lVar17 != -1)) {
            std::__cxx11::string::substr((ulong)&local_a20,(ulong)local_638);
            std::__cxx11::string::operator=((string *)local_908,(string *)&local_a20);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
              operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::erase((ulong)local_638,0);
          }
          if (local_638._8_8_ != 0) {
            sVar29 = 0;
            do {
              if (*(char *)(local_638._0_8_ + sVar29) == '/') {
                *(char *)(local_638._0_8_ + sVar29) = '\\';
              }
              sVar29 = sVar29 + 1;
            } while (local_638._8_8_ != sVar29);
          }
          componentName_01._M_str = (char *)local_908;
          componentName_01._M_len = (size_t)local_900;
          CustomComponentInstallDirectory_abi_cxx11_(&local_a20,local_a28,componentName_01);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  RMDir \"",9);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,local_a20._M_dataplus._M_p,
                               local_a20._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\\",1);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_638._0_8_,local_638._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (local_900 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            pmVar18 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                                    *)local_640,(key_type *)local_908);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pmVar18->Directories,(string *)local_638);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
            operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628) {
          operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
        }
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar39);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_908,"Uninstall Dirs: ",0x10)
    ;
    pcVar38 = local_a28;
    std::__cxx11::stringbuf::str();
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_908,(char *)local_638._0_8_,local_638._8_8_);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628) {
      operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
    }
    pcVar6 = (pcVar38->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar34 = local_638._0_8_;
    sVar16 = strlen((char *)local_638._0_8_);
    cmCPackLog::Log(pcVar6,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,(char *)uVar34,sVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628) {
      operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
    std::ios_base::~ios_base((ios_base *)&local_898);
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_DELETE_DIRECTORIES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628) {
      operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
    }
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_908,"Configure file: ",0x10)
    ;
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_908,local_3c8._M_dataplus._M_p,local_3c8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," to ",4);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_9e8->_M_local_buf,(long)local_9e0);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pcVar6 = (pcVar38->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar34 = local_638._0_8_;
    sVar16 = strlen((char *)local_638._0_8_);
    cmCPackLog::Log(pcVar6,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x81,(char *)uVar34,sVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628) {
      operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
    std::ios_base::~ios_base((ios_base *)&local_898);
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"CPACK_NSIS_MUI_ICON","");
    bVar10 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    bVar11 = true;
    if (!bVar10) {
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a8,"CPACK_NSIS_MUI_UNIICON","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11 != false) {
      local_638._0_8_ = local_628;
      local_638._8_8_ = 0;
      local_628._0_8_ = local_628._0_8_ & 0xffffffffffffff00;
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"CPACK_NSIS_MUI_ICON","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (bVar11) {
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_660,"CPACK_NSIS_MUI_ICON","");
        psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_660)
        ;
        local_908 = (undefined1  [8])0x12;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x81fa4d;
        local_8f8._M_allocated_capacity = 0;
        if (psVar13 == (string *)0x0) {
          psVar13 = &cmValue::Empty_abi_cxx11_;
        }
        local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar13->_M_dataplus)._M_p;
        local_8f8._8_8_ = psVar13->_M_string_length;
        local_8e0 = 0;
        local_8d8._M_allocated_capacity = 2;
        local_8d8._8_8_ = "\"\n";
        local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_908;
        cmCatViews(&local_a20,views_00);
        std::__cxx11::string::_M_append(local_638,(ulong)local_a20._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,
                          CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                   local_660.field_2._M_local_buf[0]) + 1);
        }
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_MUI_UNIICON","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (bVar11) {
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_660,"CPACK_NSIS_MUI_UNIICON","");
        psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_660)
        ;
        local_908 = (undefined1  [8])0x14;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x81fa60;
        local_8f8._M_allocated_capacity = 0;
        if (psVar13 == (string *)0x0) {
          psVar13 = &cmValue::Empty_abi_cxx11_;
        }
        local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar13->_M_dataplus)._M_p;
        local_8f8._8_8_ = psVar13->_M_string_length;
        local_8e0 = 0;
        local_8d8._M_allocated_capacity = 2;
        local_8d8._8_8_ = "\"\n";
        local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_908;
        cmCatViews(&local_a20,views_01);
        std::__cxx11::string::_M_append(local_638,(ulong)local_a20._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,
                          CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                   local_660.field_2._M_local_buf[0]) + 1);
        }
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(char *)local_638._0_8_);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    local_660._M_string_length = 0;
    local_660.field_2._M_local_buf[0] = '\0';
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_MUI_HEADERIMAGE","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    local_908 = (undefined1  [8])&local_8f8;
    if (bVar11) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_MUI_HEADERIMAGE","");
      cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      std::__cxx11::string::_M_assign((string *)&local_660);
LAB_001bb71c:
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"CPACK_PACKAGE_ICON","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (bVar11) {
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"CPACK_PACKAGE_ICON","")
        ;
        cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,(string *)local_908);
        std::__cxx11::string::_M_assign((string *)&local_660);
        goto LAB_001bb71c;
      }
    }
    if (local_660._M_string_length != 0) {
      local_908 = (undefined1  [8])0x20;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fab3;
      local_8f8._M_allocated_capacity = 0;
      local_8f8._8_8_ = local_660._M_string_length;
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_660._M_dataplus._M_p;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = 2;
      local_8d8._8_8_ = "\"\n";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_908;
      cmCatViews((string *)local_638,views_02);
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a20,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a20);
      local_908 = (undefined1  [8])0x26;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fb1b;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = 2;
      local_8d8._8_8_ = "\"\n";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_03._M_len = 3;
      views_03._M_array = (iterator)local_908;
      cmCatViews((string *)local_638,views_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a20,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a20);
      local_908 = (undefined1  [8])&DAT_00000028;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fb98;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = 2;
      local_8d8._8_8_ = "\"\n";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_04._M_len = 3;
      views_04._M_array = (iterator)local_908;
      cmCatViews((string *)local_638,views_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    paVar3 = &local_988.field_2;
    if (bVar11) {
      local_988._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_988,"CPACK_NSIS_EXECUTABLES_DIRECTORY","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_988);
      local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_948,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
      psVar19 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_948);
      local_908 = (undefined1  [8])0x25;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fc0d;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._8_8_ = local_628 + 8;
      local_638._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_638._8_8_ = 1;
      local_628[8] = '\\';
      local_8d8._M_allocated_capacity = (size_type)&DAT_00000001;
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (psVar19 == (string *)0x0) {
        psVar19 = &cmValue::Empty_abi_cxx11_;
      }
      local_8b8._M_dataplus._M_p = (psVar19->_M_dataplus)._M_p;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar19->_M_string_length;
      local_8b8._M_string_length = 0;
      local_8b8.field_2._M_allocated_capacity = 2;
      local_8b8.field_2._8_8_ = "\"\n";
      local_898 = 0;
      views_05._M_len = 5;
      views_05._M_array = (iterator)local_908;
      local_628._0_8_ = local_8d8._8_8_;
      cmCatViews(&local_a20,views_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p,
                        CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                 local_948.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_988._M_dataplus._M_p != paVar3) {
        operator_delete(local_988._M_dataplus._M_p,
                        CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                 local_988.field_2._M_local_buf[0]) + 1);
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,&local_a20);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_WELCOME_TITLE","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a20,"CPACK_NSIS_WELCOME_TITLE","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a20);
      local_908 = (undefined1  [8])0x1f;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fc9a;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = (size_type)&DAT_00000001;
      local_8d8._8_8_ = "\"";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_06._M_len = 3;
      views_06._M_array = (iterator)local_908;
      cmCatViews((string *)local_638,views_06);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_WELCOME_TITLE_3LINES","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,
                 "!define MUI_WELCOMEPAGE_TITLE_3LINES");
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_FINISH_TITLE","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a20,"CPACK_NSIS_FINISH_TITLE","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a20);
      local_908 = (undefined1  [8])&DAT_0000001e;
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x81fd6e;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = (size_type)&DAT_00000001;
      local_8d8._8_8_ = "\"";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_07._M_len = 3;
      views_07._M_array = (iterator)local_908;
      cmCatViews((string *)local_638,views_07);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_FINISH_TITLE_3LINES","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,
                 "!define MUI_FINISHPAGE_TITLE_3LINES");
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_MANIFEST_DPI_AWARE","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_MANIFEST_DPI_AWARE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar38->super_cmCPackGenerator,(string *)local_908,"ManifestDPIAware true");
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
    }
    local_908 = (undefined1  [8])&local_8f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_908,"CPACK_NSIS_BRANDING_TEXT","");
    bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
    if (local_908 != (undefined1  [8])&local_8f8) {
      operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
    }
    if (bVar11) {
      paVar2 = &local_a20.field_2;
      local_a20._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a20,"LEFT","");
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (!bVar11) {
LAB_001bc6e9:
        local_988._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_988,"CPACK_NSIS_BRANDING_TEXT","");
        psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_988)
        ;
        local_908 = (undefined1  [8])0x12;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x81feec;
        local_8f8._M_allocated_capacity = 0;
        local_8f8._8_8_ = local_a20._M_string_length;
        local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a20._M_dataplus._M_p;
        local_8e0 = 0;
        local_8d8._M_allocated_capacity = 2;
        local_8d8._8_8_ = " \"";
        local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (psVar13 == (string *)0x0) {
          psVar13 = &cmValue::Empty_abi_cxx11_;
        }
        local_8b8._M_dataplus._M_p = (psVar13->_M_dataplus)._M_p;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar13->_M_string_length;
        local_8b8._M_string_length = 0;
        local_8b8.field_2._M_allocated_capacity = 2;
        local_8b8.field_2._8_8_ = "\"\n";
        local_898 = 0;
        views_08._M_len = 5;
        views_08._M_array = (iterator)local_908;
        cmCatViews((string *)local_638,views_08);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_988._M_dataplus._M_p != paVar3) {
          operator_delete(local_988._M_dataplus._M_p,
                          CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                   local_988.field_2._M_local_buf[0]) + 1);
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_BRANDING_TEXT_CODE","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628) {
          operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != paVar2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001bc88a;
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION","");
      psVar13 = (string *)
                cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar5 = (psVar13->_M_dataplus)._M_p;
      local_988._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_988,pcVar5,pcVar5 + psVar13->_M_string_length);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_988._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_001bc6cc:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_988._M_dataplus._M_p != paVar3) {
          operator_delete(local_988._M_dataplus._M_p,
                          CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                   local_988.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_001bc6e9;
      }
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"CENTER","");
      local_8e8 = &local_8d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"LEFT","");
      pbVar31 = &local_8b8;
      local_8c8 = pbVar31;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"RIGHT","");
      __l._M_len = 3;
      __l._M_array = (iterator)local_908;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_638,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_948,(allocator_type *)local_928._M_local_buf);
      lVar17 = -0x60;
      do {
        if (pbVar31 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pbVar31[-1].field_2._M_allocated_capacity) {
          operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pbVar31[-1].field_2._M_allocated_capacity,
                          (ulong)((pbVar31->_M_dataplus)._M_p + 1));
        }
        pbVar31 = pbVar31 + -1;
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0);
      cVar20 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_638,&local_988);
      if (cVar20._M_node == (_Base_ptr)(local_638 + 8)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_908,"Unsupported branding text trim position ",0x28);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_908,local_988._M_dataplus._M_p,
                             local_988._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar15);
        pcVar6 = (local_a28->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var32._M_p = local_948._M_dataplus._M_p;
        sVar16 = strlen(local_948._M_dataplus._M_p);
        cmCPackLog::Log(pcVar6,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0xe3,_Var32._M_p,sVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948._M_dataplus._M_p != &local_948.field_2) {
          operator_delete(local_948._M_dataplus._M_p,
                          CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                   local_948.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
        std::ios_base::~ios_base((ios_base *)&local_898);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_a20);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_638);
      pcVar38 = local_a28;
      if (cVar20._M_node != (_Base_ptr)(local_638 + 8)) goto LAB_001bc6cc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_988._M_dataplus._M_p != paVar3) {
        operator_delete(local_988._M_dataplus._M_p,
                        CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                 local_988.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != paVar2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      iVar12 = 0;
    }
    else {
LAB_001bc88a:
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_IGNORE_LICENSE_PAGE","");
      bVar11 = cmCPackGenerator::IsSet(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (!bVar11) {
        local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a20,"CPACK_RESOURCE_FILE_LICENSE","");
        psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a20)
        ;
        local_908 = (undefined1  [8])0x1f;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x81ff3c;
        local_8f8._M_allocated_capacity = 0;
        if (psVar13 == (string *)0x0) {
          psVar13 = &cmValue::Empty_abi_cxx11_;
        }
        local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar13->_M_dataplus)._M_p;
        local_8f8._8_8_ = psVar13->_M_string_length;
        local_8e0 = 0;
        local_8d8._M_allocated_capacity = 2;
        local_8d8._8_8_ = "\"\n";
        local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_09._M_len = 3;
        views_09._M_array = (iterator)local_908;
        cmCatViews((string *)local_638,views_09);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_LICENSE_PAGE","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,(string *)local_908,(string *)local_638);
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628) {
          operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
        }
      }
      local_988._M_string_length = 0;
      local_988.field_2._M_local_buf[0] = '\0';
      local_908 = (undefined1  [8])&local_8f8;
      local_988._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS","");
      cVar21 = cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (cVar21.Value != (string *)0x0) {
        local_908 = (undefined1  [8])&local_8f8;
        pcVar5 = ((cVar21.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_908,pcVar5,pcVar5 + (cVar21.Value)->_M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)local_908;
        cmList::cmList((cmList *)&local_948,init);
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        if (local_948._M_dataplus._M_p != (pointer)local_948._M_string_length) {
          _Var32._M_p = local_948._M_dataplus._M_p;
          do {
            local_900 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)_Var32._M_p;
            local_908 = *(undefined1 (*) [8])((long)_Var32._M_p + 8);
            __str._M_str = "-";
            __str._M_len = 1;
            iVar12 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_908,0,1,
                                __str);
            if (iVar12 != 0) {
              local_908 = (undefined1  [8])local_988._M_string_length;
              local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_988._M_dataplus._M_p;
              local_8f8._M_allocated_capacity = 0;
              local_8f8._8_8_ = 1;
              local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x87cb13;
              local_8e0 = 0;
              views_10._M_len = 2;
              views_10._M_array = (iterator)local_908;
              cmCatViews((string *)local_638,views_10);
              std::__cxx11::string::operator=((string *)&local_988,(string *)local_638);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_628) {
                operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
              }
            }
            local_908 = (undefined1  [8])local_988._M_string_length;
            local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_988._M_dataplus._M_p;
            local_8f8._M_allocated_capacity = 0;
            local_8e8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)_Var32._M_p;
            local_8f8._8_8_ = *(long *)((long)_Var32._M_p + 8);
            local_8e0 = 0;
            local_638._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_638._8_8_ = 1;
            local_8d8._8_8_ = local_628 + 8;
            local_628[8] = ' ';
            local_8d8._M_allocated_capacity = (size_type)&DAT_00000001;
            local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            views_11._M_len = 3;
            views_11._M_array = (iterator)local_908;
            local_628._0_8_ = local_8d8._8_8_;
            cmCatViews(&local_a20,views_11);
            std::__cxx11::string::operator=((string *)&local_988,(string *)&local_a20);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
              operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1
                             );
            }
            _Var32._M_p = _Var32._M_p + 0x20;
          } while (_Var32._M_p != (pointer)local_948._M_string_length);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_948);
        pcVar38 = local_a28;
      }
      local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
      local_948._M_string_length = 0;
      local_948.field_2._M_local_buf[0] = '\0';
      local_908 = (undefined1  [8])&local_8f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_908,"CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS","");
      cVar21 = cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,(string *)local_908);
      if (local_908 != (undefined1  [8])&local_8f8) {
        operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
      }
      if (cVar21.Value != (string *)0x0) {
        local_908 = (undefined1  [8])&local_8f8;
        pcVar5 = ((cVar21.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_908,pcVar5,pcVar5 + (cVar21.Value)->_M_string_length);
        init_00._M_len = 1;
        init_00._M_array = (iterator)local_908;
        cmList::cmList((cmList *)&local_928,init_00);
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        uVar34 = local_928._8_8_;
        if (local_928._M_allocated_capacity != local_928._8_8_) {
          uVar33 = local_928._M_allocated_capacity;
          do {
            local_900 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)uVar33;
            local_908 = *(undefined1 (*) [8])(uVar33 + 8);
            __str_00._M_str = "-";
            __str_00._M_len = 1;
            iVar12 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_908,0,1,
                                __str_00);
            if (iVar12 != 0) {
              local_908 = (undefined1  [8])local_948._M_string_length;
              local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_948._M_dataplus._M_p;
              local_8f8._M_allocated_capacity = 0;
              local_8f8._8_8_ = 1;
              local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x87cb13;
              local_8e0 = 0;
              views_12._M_len = 2;
              views_12._M_array = (iterator)local_908;
              cmCatViews((string *)local_638,views_12);
              std::__cxx11::string::operator=((string *)&local_948,(string *)local_638);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_628) {
                operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
              }
            }
            local_908 = (undefined1  [8])local_948._M_string_length;
            local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_948._M_dataplus._M_p;
            local_8f8._M_allocated_capacity = 0;
            local_8e8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)uVar33;
            local_8f8._8_8_ = *(long *)(uVar33 + 8);
            local_8e0 = 0;
            local_638._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_638._8_8_ = 1;
            local_8d8._8_8_ = local_628 + 8;
            local_628[8] = ' ';
            local_8d8._M_allocated_capacity = (size_type)&DAT_00000001;
            local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            views_13._M_len = 3;
            views_13._M_array = (iterator)local_908;
            local_628._0_8_ = local_8d8._8_8_;
            cmCatViews(&local_a20,views_13);
            std::__cxx11::string::operator=((string *)&local_948,(string *)&local_a20);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
              operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1
                             );
            }
            uVar33 = uVar33 + 0x20;
          } while (uVar33 != uVar34);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_928);
        pcVar38 = local_a28;
      }
      if ((pcVar38->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
          _M_node_count == 0) {
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_INSTALLATION_TYPES","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_PAGE_COMPONENTS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_FULL_INSTALL","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,(string *)local_908,
                   "File /r \"${INST_DIR}\\*.*\"");
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_COMPONENT_SECTIONS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        if (local_908 != (undefined1  [8])&local_8f8) {
          operator_delete((void *)local_908,(ulong)(local_8f8._M_allocated_capacity + 1));
        }
        local_908 = (undefined1  [8])&local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,"CPACK_NSIS_SECTION_SELECTED_VARS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,(string *)local_908,"")
        ;
        uVar34 = local_8f8._M_allocated_capacity;
        auVar35 = local_908;
        if (local_908 != (undefined1  [8])&local_8f8) goto LAB_001be256;
      }
      else {
        local_638._0_8_ = local_628;
        local_638._8_8_ = 0;
        local_628._0_8_ = local_628._0_8_ & 0xffffffffffffff00;
        local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
        local_a20._M_string_length = 0;
        local_a20.field_2._M_allocated_capacity =
             local_a20.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_928._M_allocated_capacity = (size_type)&local_918;
        local_928._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_918._M_local_buf[0] = '\0';
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        local_680._M_string_length = 0;
        local_680.field_2._M_local_buf[0] = '\0';
        local_4a0 = &local_490;
        local_498 = 0;
        local_490 = 0;
        local_408 = &local_3f8;
        local_400 = 0;
        local_3f8 = 0;
        local_468 = &local_458;
        local_460 = 0;
        local_458 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                  (&local_480,
                   (pcVar38->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                   super__Rb_tree_header._M_node_count,(allocator_type *)&local_a48);
        for (p_Var22 = (pcVar38->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var22 !=
            &(pcVar38->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
            p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22)) {
          local_480.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_start[p_Var22[4]._M_color - _S_black] =
               (cmCPackInstallationType *)(p_Var22 + 2);
        }
        if (local_480.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_480.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ppcVar36 = local_480.
                     super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar7 = *ppcVar36;
            std::__cxx11::string::append((char *)&local_408);
            std::__cxx11::string::_M_append
                      ((char *)&local_408,(ulong)(pcVar7->DisplayName)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_408);
            ppcVar36 = ppcVar36 + 1;
          } while (ppcVar36 !=
                   local_480.
                   super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        p_Var25 = (local_a28->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(local_a28->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                  super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var25 != p_Var1) {
          paVar3 = &local_a48.field_2;
          do {
            if (*(long *)(p_Var25 + 6) == 0) {
              CreateComponentGroupDescription_abi_cxx11_
                        (&local_a48,local_a28,(cmCPackComponentGroup *)(p_Var25 + 2),
                         (ostream *)local_908);
              std::__cxx11::string::_M_append(local_638,(ulong)local_a48._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a48._M_dataplus._M_p != paVar3) {
                operator_delete(local_a48._M_dataplus._M_p,
                                local_a48.field_2._M_allocated_capacity + 1);
              }
            }
            if (p_Var25[4]._M_parent != (_Base_ptr)0x0) {
              std::operator+(&local_4c0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var25 + 1));
              plVar23 = (long *)std::__cxx11::string::append((char *)&local_4c0);
              puVar26 = (ulong *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar26) {
                local_958._M_allocated_capacity = *puVar26;
                local_958._8_4_ = (undefined4)plVar23[3];
                local_958._12_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
                local_968._M_allocated_capacity = (size_type)&local_958;
              }
              else {
                local_958._M_allocated_capacity = *puVar26;
                local_968._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar23;
              }
              local_968._8_8_ = plVar23[1];
              *plVar23 = (long)puVar26;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_428,*(long *)(p_Var25 + 4),
                         (long)&(p_Var25[4]._M_parent)->_M_color + *(long *)(p_Var25 + 4));
              TranslateNewlines(&local_6a0,&local_428);
              uVar34 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_968._M_allocated_capacity != &local_958) {
                uVar34 = local_958._M_allocated_capacity;
              }
              if ((ulong)uVar34 < local_6a0._M_string_length + local_968._8_8_) {
                uVar34 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                  uVar34 = local_6a0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar34 < local_6a0._M_string_length + local_968._8_8_) goto LAB_001bd2be;
                puVar24 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_6a0,0,(char *)0x0,local_968._M_allocated_capacity
                                    );
              }
              else {
LAB_001bd2be:
                puVar24 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    (local_968._M_local_buf,(ulong)local_6a0._M_dataplus._M_p);
              }
              psVar27 = puVar24 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar24 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_9a8.field_2._M_allocated_capacity = *psVar27;
                local_9a8.field_2._8_8_ = puVar24[3];
                local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
              }
              else {
                local_9a8.field_2._M_allocated_capacity = *psVar27;
                local_9a8._M_dataplus._M_p = (pointer)*puVar24;
              }
              local_9a8._M_string_length = puVar24[1];
              *puVar24 = psVar27;
              puVar24[1] = 0;
              *(undefined1 *)psVar27 = 0;
              plVar23 = (long *)std::__cxx11::string::append((char *)&local_9a8);
              psVar27 = (size_type *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48.field_2._8_8_ = plVar23[3];
                local_a48._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48._M_dataplus._M_p = (pointer)*plVar23;
              }
              local_a48._M_string_length = plVar23[1];
              *plVar23 = (long)psVar27;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_a48._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a48._M_dataplus._M_p != paVar3) {
                operator_delete(local_a48._M_dataplus._M_p,
                                local_a48.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                operator_delete(local_9a8._M_dataplus._M_p,
                                local_9a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                operator_delete(local_6a0._M_dataplus._M_p,
                                local_6a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_968._M_allocated_capacity != &local_958) {
                operator_delete((void *)local_968._M_allocated_capacity,
                                local_958._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                operator_delete(local_4c0._M_dataplus._M_p,
                                local_4c0.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
          } while ((_Rb_tree_header *)p_Var25 != p_Var1);
        }
        p_Var25 = (local_a28->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        local_640 = &(local_a28->super_cmCPackGenerator).Components._M_t._M_impl.
                     super__Rb_tree_header._M_header;
        if (p_Var25 == local_640) {
          bVar37 = 0;
        }
        else {
          paVar3 = &local_a48.field_2;
          bVar37 = 0;
          do {
            if (p_Var25[9]._M_right != *(_Base_ptr *)(p_Var25 + 10)) {
              bVar8 = bVar37 & 1;
              bVar37 = *(byte *)&p_Var25[4]._M_parent >> 3;
              if (bVar8 != 0) {
                bVar37 = 1;
              }
              if (*(long *)(p_Var25 + 4) == 0) {
                CreateComponentDescription_abi_cxx11_
                          (&local_a48,local_a28,(cmCPackComponent *)(p_Var25 + 2),
                           (ostream *)local_908);
                std::__cxx11::string::_M_append(local_638,(ulong)local_a48._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a48._M_dataplus._M_p != paVar3) {
                  operator_delete(local_a48._M_dataplus._M_p,
                                  local_a48.field_2._M_allocated_capacity + 1);
                }
              }
              std::__cxx11::string::append((char *)&local_a20);
              std::__cxx11::string::_M_append((char *)&local_a20,*(ulong *)(p_Var25 + 1));
              std::__cxx11::string::append((char *)&local_a20);
              p_Var22 = p_Var25 + 1;
              std::operator+(&local_9a8,"Var ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var22);
              plVar23 = (long *)std::__cxx11::string::append((char *)&local_9a8);
              psVar27 = (size_type *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48.field_2._8_8_ = plVar23[3];
                local_a48._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48._M_dataplus._M_p = (pointer)*plVar23;
              }
              local_a48._M_string_length = plVar23[1];
              *plVar23 = (long)psVar27;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              std::__cxx11::string::_M_append
                        (local_928._M_local_buf,(ulong)local_a48._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a48._M_dataplus._M_p != paVar3) {
                operator_delete(local_a48._M_dataplus._M_p,
                                local_a48.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                operator_delete(local_9a8._M_dataplus._M_p,
                                local_9a8.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_9a8,"Var ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var22);
              plVar23 = (long *)std::__cxx11::string::append((char *)&local_9a8);
              psVar27 = (size_type *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48.field_2._8_8_ = plVar23[3];
                local_a48._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_a48.field_2._M_allocated_capacity = *psVar27;
                local_a48._M_dataplus._M_p = (pointer)*plVar23;
              }
              local_a48._M_string_length = plVar23[1];
              *plVar23 = (long)psVar27;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              std::__cxx11::string::_M_append
                        (local_928._M_local_buf,(ulong)local_a48._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a48._M_dataplus._M_p != paVar3) {
                operator_delete(local_a48._M_dataplus._M_p,
                                local_a48.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                operator_delete(local_9a8._M_dataplus._M_p,
                                local_9a8.field_2._M_allocated_capacity + 1);
              }
              if (p_Var25[4]._M_right != (_Base_ptr)0x0) {
                std::operator+(&local_4c0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var22);
                plVar23 = (long *)std::__cxx11::string::append((char *)&local_4c0);
                local_968._M_allocated_capacity = (size_type)&local_958;
                puVar26 = (ulong *)(plVar23 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar26) {
                  local_958._M_allocated_capacity = *puVar26;
                  local_958._8_4_ = (undefined4)plVar23[3];
                  local_958._12_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
                }
                else {
                  local_958._M_allocated_capacity = *puVar26;
                  local_968._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar23;
                }
                local_968._8_8_ = plVar23[1];
                *plVar23 = (long)puVar26;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_448,p_Var25[4]._M_left,
                           (long)&(p_Var25[4]._M_right)->_M_color + (long)p_Var25[4]._M_left);
                TranslateNewlines(&local_6a0,&local_448);
                uVar34 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_968._M_allocated_capacity != &local_958) {
                  uVar34 = local_958._M_allocated_capacity;
                }
                if ((ulong)uVar34 < local_6a0._M_string_length + local_968._8_8_) {
                  uVar34 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                    uVar34 = local_6a0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar34 < local_6a0._M_string_length + local_968._8_8_)
                  goto LAB_001bd800;
                  puVar24 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_6a0,0,(char *)0x0,
                                       local_968._M_allocated_capacity);
                }
                else {
LAB_001bd800:
                  puVar24 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      (local_968._M_local_buf,(ulong)local_6a0._M_dataplus._M_p);
                }
                local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
                psVar27 = puVar24 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar24 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_9a8.field_2._M_allocated_capacity = *psVar27;
                  local_9a8.field_2._8_8_ = puVar24[3];
                }
                else {
                  local_9a8.field_2._M_allocated_capacity = *psVar27;
                  local_9a8._M_dataplus._M_p = (pointer)*puVar24;
                }
                local_9a8._M_string_length = puVar24[1];
                *puVar24 = psVar27;
                puVar24[1] = 0;
                *(undefined1 *)psVar27 = 0;
                plVar23 = (long *)std::__cxx11::string::append((char *)&local_9a8);
                psVar27 = (size_type *)(plVar23 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_a48.field_2._M_allocated_capacity = *psVar27;
                  local_a48.field_2._8_8_ = plVar23[3];
                  local_a48._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_a48.field_2._M_allocated_capacity = *psVar27;
                  local_a48._M_dataplus._M_p = (pointer)*plVar23;
                }
                local_a48._M_string_length = plVar23[1];
                *plVar23 = (long)psVar27;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_680,(ulong)local_a48._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a48._M_dataplus._M_p != paVar3) {
                  operator_delete(local_a48._M_dataplus._M_p,
                                  local_a48.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                  operator_delete(local_9a8._M_dataplus._M_p,
                                  local_9a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                  operator_delete(local_6a0._M_dataplus._M_p,
                                  local_6a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_448._M_dataplus._M_p != &local_448.field_2) {
                  operator_delete(local_448._M_dataplus._M_p,
                                  local_448.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_968._M_allocated_capacity != &local_958) {
                  operator_delete((void *)local_968._M_allocated_capacity,
                                  local_958._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                  operator_delete(local_4c0._M_dataplus._M_p,
                                  local_4c0.field_2._M_allocated_capacity + 1);
                }
              }
            }
            p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
          } while (p_Var25 != local_640);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append(local_638,(ulong)local_a48._M_dataplus._M_p);
        paVar3 = &local_a48.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        if (local_498 == 0 && local_680._M_string_length == 0) {
          local_a48._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a48,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
          cmCPackGenerator::SetOptionIfNotSet
                    (&local_a28->super_cmCPackGenerator,&local_a48,
                     "!define MUI_COMPONENTSPAGE_NODESC");
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_968,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",&local_680);
          puVar24 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_968._M_local_buf,(ulong)local_4a0);
          psVar27 = puVar24 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar24 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_9a8.field_2._M_allocated_capacity = *psVar27;
            local_9a8.field_2._8_8_ = puVar24[3];
            local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
          }
          else {
            local_9a8.field_2._M_allocated_capacity = *psVar27;
            local_9a8._M_dataplus._M_p = (pointer)*puVar24;
          }
          local_9a8._M_string_length = puVar24[1];
          *puVar24 = psVar27;
          puVar24[1] = 0;
          *(undefined1 *)(puVar24 + 2) = 0;
          plVar23 = (long *)std::__cxx11::string::append((char *)&local_9a8);
          psVar27 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_a48.field_2._M_allocated_capacity = *psVar27;
            local_a48.field_2._8_8_ = plVar23[3];
            local_a48._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_a48.field_2._M_allocated_capacity = *psVar27;
            local_a48._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_a48._M_string_length = plVar23[1];
          *plVar23 = (long)psVar27;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_680,(string *)&local_a48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a48._M_dataplus._M_p != paVar3) {
            operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
            operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_968._M_allocated_capacity != &local_958) {
            operator_delete((void *)local_968._M_allocated_capacity,
                            local_958._M_allocated_capacity + 1);
          }
          local_a48._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a48,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
          cmCPackGenerator::SetOptionIfNotSet
                    (&local_a28->super_cmCPackGenerator,&local_a48,&local_680);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        pcVar38 = local_a28;
        if ((bVar37 & 1) != 0) {
          std::__cxx11::string::append((char *)&local_468);
          local_a48._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a48,"CPACK_ADD_REMOVE","");
          cVar21 = cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_a48);
          if (cVar21.Value == (string *)0x0) {
            bVar11 = false;
          }
          else {
            value._M_str = extraout_RDX;
            value._M_len = (size_t)((cVar21.Value)->_M_dataplus)._M_p;
            bVar11 = cmValue::IsOn((cmValue *)(cVar21.Value)->_M_string_length,value);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a48._M_dataplus._M_p != paVar3) {
            operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
          }
          if (bVar11 != false) {
            std::__cxx11::string::append((char *)&local_468);
          }
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_INSTALLATION_TYPES","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,&local_a48,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_PAGE_COMPONENTS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,&local_a48,"!insertmacro MUI_PAGE_COMPONENTS");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_FULL_INSTALL","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,&local_a48,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_COMPONENT_SECTIONS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,&local_a48,(string *)local_638);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar38->super_cmCPackGenerator,&local_a48,&local_a20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_SECTION_SELECTED_VARS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar38->super_cmCPackGenerator,&local_a48,(string *)&local_928);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        local_a48._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a48,"CPACK_NSIS_DEFINES","");
        cmCPackGenerator::SetOption
                  (&pcVar38->super_cmCPackGenerator,&local_a48,(string *)&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != paVar3) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        if (local_480.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_480.
                          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_480.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_480.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
        std::ios_base::~ios_base((ios_base *)&local_898);
        if (local_468 != &local_458) {
          operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
        }
        if (local_408 != &local_3f8) {
          operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0,CONCAT71(uStack_48f,local_490) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,
                          CONCAT71(local_680.field_2._M_allocated_capacity._1_7_,
                                   local_680.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_allocated_capacity != &local_918) {
          operator_delete((void *)local_928._M_allocated_capacity,
                          CONCAT71(local_918._M_allocated_capacity._1_7_,local_918._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        uVar34 = local_628._0_8_;
        auVar35 = (undefined1  [8])local_638._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628) {
LAB_001be256:
          operator_delete((void *)auVar35,(ulong)(uVar34 + 1));
        }
      }
      (*(pcVar38->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (pcVar38,&local_388,&local_9c8);
      (*(pcVar38->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (pcVar38,&local_3c8,&local_9e8);
      paVar3 = &local_680.field_2;
      local_680._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_680,"CPACK_INSTALLER_PROGRAM","");
      psVar13 = (string *)cmCPackGenerator::GetOption(&pcVar38->super_cmCPackGenerator,&local_680);
      local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_628 + 8);
      local_638._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_638._8_8_ = 1;
      local_628[8] = '\"';
      local_908 = (undefined1  [8])&DAT_00000001;
      local_8f8._M_allocated_capacity = 0;
      if (psVar13 == (string *)0x0) {
        psVar13 = &cmValue::Empty_abi_cxx11_;
      }
      local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar13->_M_dataplus)._M_p;
      local_8f8._8_8_ = psVar13->_M_string_length;
      local_8e0 = 0;
      local_8d8._M_allocated_capacity = 2;
      local_8d8._8_8_ = "\" ";
      local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988._M_string_length;
      local_8b8._M_dataplus._M_p = local_988._M_dataplus._M_p;
      local_8b8._M_string_length = 0;
      local_8b8.field_2._M_allocated_capacity = 2;
      local_8b8.field_2._8_8_ = " \"";
      local_898 = 0;
      local_890 = local_9e0;
      local_888 = local_9e8;
      local_880 = 0;
      local_a20.field_2._M_allocated_capacity = (long)&local_a20.field_2 + 8;
      local_a20._M_dataplus._M_p = (pointer)0x0;
      local_a20._M_string_length = 1;
      local_a20.field_2._M_local_buf[8] = '\"';
      local_878 = 1;
      local_868 = 0;
      views_14._M_len = 7;
      views_14._M_array = (iterator)local_908;
      local_870 = (undefined1 *)local_a20.field_2._M_allocated_capacity;
      local_628._0_8_ = local_900;
      cmCatViews((string *)&local_928,views_14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680._M_dataplus._M_p != paVar3) {
        operator_delete(local_680._M_dataplus._M_p,
                        CONCAT71(local_680.field_2._M_allocated_capacity._1_7_,
                                 local_680.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_908 = (undefined1  [8])local_928._8_8_;
        local_900 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_928._M_allocated_capacity;
        local_8f8._M_allocated_capacity = 0;
        local_8f8._8_8_ = 1;
        local_8e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x85d3d5;
        local_8e0 = 0;
        local_8d8._M_allocated_capacity = local_948._M_string_length;
        local_8d8._8_8_ = local_948._M_dataplus._M_p;
        local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_15._M_len = 3;
        views_15._M_array = (iterator)local_908;
        cmCatViews((string *)local_638,views_15);
        std::__cxx11::string::operator=((string *)local_928._M_local_buf,(string *)local_638);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628) {
          operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_908,"Execute: ",9);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_908,(char *)local_928._M_allocated_capacity,
                           local_928._8_8_);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      pcVar6 = (pcVar38->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar34 = local_638._0_8_;
      sVar16 = strlen((char *)local_638._0_8_);
      cmCPackLog::Log(pcVar6,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x188,(char *)uVar34,sVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628) {
        operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
      std::ios_base::~ios_base((ios_base *)&local_898);
      local_a20._M_string_length = 0;
      local_a20.field_2._M_allocated_capacity =
           local_a20.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_4a0 = (undefined1 *)CONCAT44(local_4a0._4_4_,1);
      local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
      bVar11 = cmSystemTools::RunSingleCommand
                         ((string *)&local_928,&local_a20,&local_a20,(int *)&local_4a0,(char *)0x0,
                          (pcVar38->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0);
      iVar12 = 1;
      if (!bVar11 || (int)local_4a0 != 0) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_908,&local_3e8,false,None);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_908,"# Run command: ",0xf);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_908,(char *)local_928._M_allocated_capacity,
                             local_928._8_8_);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        poVar15 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"# Output:",9);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        poVar15 = (ostream *)std::ostream::flush();
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_a20._M_dataplus._M_p,local_a20._M_string_length);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_638,"Problem running NSIS command: ",0x1e);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_638,(char *)local_928._M_allocated_capacity,
                             local_928._8_8_);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        poVar15 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Please check ",0xd);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," for errors",0xb);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        pcVar6 = (pcVar38->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var32._M_p = local_680._M_dataplus._M_p;
        sVar16 = strlen(local_680._M_dataplus._M_p);
        cmCPackLog::Log(pcVar6,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0x197,_Var32._M_p,sVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != paVar3) {
          operator_delete(local_680._M_dataplus._M_p,
                          CONCAT71(local_680.field_2._M_allocated_capacity._1_7_,
                                   local_680.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
        std::ios_base::~ios_base(local_5c8);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_908);
        iVar12 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
        operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_allocated_capacity != &local_918) {
        operator_delete((void *)local_928._M_allocated_capacity,
                        CONCAT71(local_918._M_allocated_capacity._1_7_,local_918._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p,
                        CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                 local_948.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_988._M_dataplus._M_p != &local_988.field_2) {
        operator_delete(local_988._M_dataplus._M_p,
                        CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                 local_988.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,
                      CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                               local_660.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((long *)local_9c8._M_allocated_capacity != local_9b8) {
      operator_delete((void *)local_9c8._M_allocated_capacity,local_9b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (local_9e8 != &local_9d8) {
      operator_delete(local_9e8,local_9d8._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
LAB_001be9d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  return iVar12;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = cmStrCat(nsisFileName, "/NSISOutput.log");
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : this->files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        auto componentName = cm::string_view(fileN).substr(0, pos);
        outputDir = this->CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = this->CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(this->toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!this->Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN.erase(0, slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      this->CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += cmStrCat(
        "!define MUI_ICON \"", this->GetOption("CPACK_NSIS_MUI_ICON"), "\"\n");
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode +=
        cmStrCat("!define MUI_UNICON \"",
                 this->GetOption("CPACK_NSIS_MUI_UNIICON"), "\"\n");
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  std::string installerHeaderImage;
  if (this->IsSet("CPACK_NSIS_MUI_HEADERIMAGE")) {
    installerHeaderImage = *this->GetOption("CPACK_NSIS_MUI_HEADERIMAGE");
  } else if (this->IsSet("CPACK_PACKAGE_ICON")) {
    installerHeaderImage = *this->GetOption("CPACK_PACKAGE_ICON");
  }
  if (!installerHeaderImage.empty()) {
    std::string installerIconCode = cmStrCat(
      "!define MUI_HEADERIMAGE_BITMAP \"", installerHeaderImage, "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode =
      cmStrCat("!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
               this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY"), '\\',
               this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE")) {
    std::string welcomeTitleCode =
      cmStrCat("!define MUI_WELCOMEPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_WELCOME_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",
                            welcomeTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",
                            "!define MUI_WELCOMEPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE")) {
    std::string finishTitleCode =
      cmStrCat("!define MUI_FINISHPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_FINISH_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",
                            finishTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",
                            "!define MUI_FINISHPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_MANIFEST_DPI_AWARE")) {
    this->SetOptionIfNotSet("CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",
                            "ManifestDPIAware true");
  }

  if (this->IsSet("CPACK_NSIS_BRANDING_TEXT")) {
    // Default position to LEFT
    std::string brandingTextPosition = "LEFT";
    if (this->IsSet("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION")) {
      std::string wantedPosition =
        this->GetOption("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION");
      if (!wantedPosition.empty()) {
        const std::set<std::string> possiblePositions{ "CENTER", "LEFT",
                                                       "RIGHT" };
        if (possiblePositions.find(wantedPosition) ==
            possiblePositions.end()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Unsupported branding text trim position "
                          << wantedPosition << std::endl);
          return false;
        }
        brandingTextPosition = wantedPosition;
      }
    }
    std::string brandingTextCode =
      cmStrCat("BrandingText /TRIM", brandingTextPosition, " \"",
               this->GetOption("CPACK_NSIS_BRANDING_TEXT"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_BRANDING_TEXT_CODE", brandingTextCode);
  }

  if (!this->IsSet("CPACK_NSIS_IGNORE_LICENSE_PAGE")) {
    std::string licenceCode =
      cmStrCat("!insertmacro MUI_PAGE_LICENSE \"",
               this->GetOption("CPACK_RESOURCE_FILE_LICENSE"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_LICENSE_PAGE", licenceCode);
  }

  std::string nsisPreArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };

    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPreArguments = cmStrCat(nsisPreArguments, NSIS_OPT);
      }
      nsisPreArguments = cmStrCat(nsisPreArguments, arg, ' ');
    }
  }

  std::string nsisPostArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };
    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPostArguments = cmStrCat(nsisPostArguments, NSIS_OPT);
      }
      nsisPostArguments = cmStrCat(nsisPostArguments, arg, ' ');
    }
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions);
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (this->GetOption("CPACK_ADD_REMOVE").IsOn()) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", installTypesCode);
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", componentCode);
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", sectionList);
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList);
    this->SetOption("CPACK_NSIS_DEFINES", defines);
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd =
    cmStrCat('"', this->GetOption("CPACK_INSTALLER_PROGRAM"), "\" ",
             nsisPreArguments, " \"", nsisFileName, '"');
  if (!nsisPostArguments.empty()) {
    nsisCmd = cmStrCat(nsisCmd, " ", nsisPostArguments);
  }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}